

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

parse_status_t scanner_get_token(scanner_t *scanner,memptr *token,token_type_t *tok_type)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  byte *pbVar9;
  token_type_t tVar10;
  byte *pbVar11;
  size_t sStack_50;
  
  if (scanner == (scanner_t *)0x0) {
    __assert_fail("scanner",".upnp/src/genlib/net/http/httpparser.c",0xe1,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  if (token == (memptr *)0x0) {
    __assert_fail("token",".upnp/src/genlib/net/http/httpparser.c",0xe2,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  if (tok_type == (token_type_t *)0x0) {
    __assert_fail("tok_type",".upnp/src/genlib/net/http/httpparser.c",0xe3,
                  "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)");
  }
  sVar4 = scanner->cursor;
  sVar5 = scanner->msg->length;
  if (sVar5 == sVar4) {
    return PARSE_INCOMPLETE;
  }
  pcVar6 = scanner->msg->buf;
  pbVar2 = (byte *)(pcVar6 + sVar4);
  pbVar11 = (byte *)(pcVar6 + sVar5);
  bVar3 = *pbVar2;
  iVar8 = is_identifier_char((int)(char)bVar3);
  if (iVar8 != 0) {
    token->buf = (char *)pbVar2;
    sVar7 = 1;
    do {
      sStack_50 = sVar7;
      if (pbVar11 <= pbVar2 + sStack_50) break;
      iVar8 = is_identifier_char((int)(char)pbVar2[sStack_50]);
      sVar7 = sStack_50 + 1;
    } while (iVar8 != 0);
    if ((scanner->entire_msg_loaded == 0) && (sVar5 - sVar4 == sStack_50)) {
      return PARSE_INCOMPLETE;
    }
    token->length = sStack_50;
    tVar10 = TT_IDENTIFIER;
    goto LAB_0010b459;
  }
  if (bVar3 == 9) {
LAB_0010b30d:
    token->buf = (char *)pbVar2;
    for (sStack_50 = 1;
        (pbVar2 + sStack_50 < pbVar11 &&
        ((bVar3 = pbVar2[sStack_50], bVar3 == 0x20 || (bVar3 == 9)))); sStack_50 = sStack_50 + 1) {
    }
    if ((scanner->entire_msg_loaded == 0) && (sVar5 - sVar4 == sStack_50)) {
      return PARSE_INCOMPLETE;
    }
    token->length = sStack_50;
    tVar10 = TT_WHITESPACE;
  }
  else {
    if (bVar3 == 10) {
      token->buf = (char *)pbVar2;
      token->length = 1;
      tVar10 = TT_CRLF;
    }
    else {
      if (bVar3 == 0xd) {
        token->buf = (char *)pbVar2;
        if (pbVar2 + 1 == pbVar11) {
          return PARSE_INCOMPLETE;
        }
        if (pbVar2[1] == 10) {
          token->length = 2;
          tVar10 = TT_CRLF;
          sStack_50 = 2;
          goto LAB_0010b459;
        }
      }
      else {
        if (bVar3 == 0x22) {
          token->buf = (char *)pbVar2;
          pbVar9 = pbVar2 + 1;
          while( true ) {
            while( true ) {
              if (pbVar11 <= pbVar9) {
                if (pbVar9 == pbVar11) {
                  return PARSE_INCOMPLETE;
                }
                __assert_fail("cursor == null_terminator",".upnp/src/genlib/net/http/httpparser.c",
                              0x131,
                              "parse_status_t scanner_get_token(scanner_t *, memptr *, token_type_t *)"
                             );
              }
              pbVar1 = pbVar9 + 1;
              bVar3 = *pbVar9;
              if (bVar3 != 0x5c) break;
              pbVar9 = pbVar9 + 2;
              if (pbVar11 <= pbVar1) {
                pbVar9 = pbVar1;
              }
            }
            if (bVar3 == 0x22) break;
            pbVar9 = pbVar1;
            if (((((int)(char)bVar3 - 0xbU < 0xfffffffe) && (bVar3 != 0xd)) && (-1 < (char)bVar3))
               && ((byte)(bVar3 + 0x81) < 0xa1)) {
              return PARSE_FAILURE;
            }
          }
          sStack_50 = (long)pbVar1 - (long)pbVar2;
          token->length = sStack_50;
          tVar10 = TT_QUOTEDSTRING;
          goto LAB_0010b459;
        }
        if (bVar3 == 0x20) goto LAB_0010b30d;
        iVar8 = is_separator_char((int)(char)bVar3);
        if (iVar8 != 0) {
          token->buf = (char *)pbVar2;
          token->length = 1;
          tVar10 = TT_SEPARATOR;
          goto LAB_0010b454;
        }
        if (0x1f < bVar3 && bVar3 != 0x7f) {
          return PARSE_FAILURE;
        }
        token->buf = (char *)pbVar2;
      }
      token->length = 1;
      tVar10 = TT_CTRL;
    }
LAB_0010b454:
    sStack_50 = 1;
  }
LAB_0010b459:
  scanner->cursor = sStack_50 + sVar4;
  *tok_type = tVar10;
  return PARSE_OK;
}

Assistant:

static parse_status_t scanner_get_token(
	scanner_t *scanner, memptr *token, token_type_t *tok_type)
{
	char *cursor;
	char *null_terminator; /* point to null-terminator in buffer */
	int c;
	token_type_t token_type;
	int got_end_quote;

	assert(scanner);
	assert(token);
	assert(tok_type);

	/* point to next char in buffer */
	cursor = scanner->msg->buf + scanner->cursor;
	null_terminator = scanner->msg->buf + scanner->msg->length;
	/* not enough chars in input to parse */
	if (cursor == null_terminator)
		return PARSE_INCOMPLETE;
	c = *cursor;
	if (is_identifier_char(c)) {
		/* scan identifier */
		token->buf = cursor++;
		token_type = TT_IDENTIFIER;
		while (cursor < null_terminator && is_identifier_char(*cursor))
			cursor++;
		if (!scanner->entire_msg_loaded && cursor == null_terminator)
			/* possibly more valid chars */
			return PARSE_INCOMPLETE;
		/* calc token length */
		token->length = (size_t)cursor - (size_t)token->buf;
	} else if (c == ' ' || c == '\t') {
		token->buf = cursor++;
		token_type = TT_WHITESPACE;
		while (cursor < null_terminator &&
			(*cursor == ' ' || *cursor == '\t'))
			cursor++;
		if (!scanner->entire_msg_loaded && cursor == null_terminator)
			/* possibly more chars */
			return PARSE_INCOMPLETE;
		token->length = (size_t)cursor - (size_t)token->buf;
	} else if (c == TOKCHAR_CR) {
		/* scan CRLF */
		token->buf = cursor++;
		if (cursor == null_terminator)
			/* not enuf info to determine CRLF */
			return PARSE_INCOMPLETE;
		if (*cursor != TOKCHAR_LF) {
			/* couldn't match CRLF; match as CR */
			token_type = TT_CTRL; /* ctrl char */
			token->length = (size_t)1;
		} else {
			/* got CRLF */
			token->length = (size_t)2;
			token_type = TT_CRLF;
			cursor++;
		}
	} else if (c == TOKCHAR_LF) { /* accept \n as CRLF */
		token->buf = cursor++;
		token->length = (size_t)1;
		token_type = TT_CRLF;
	} else if (c == '"') {
		/* quoted text */
		token->buf = cursor++;
		token_type = TT_QUOTEDSTRING;
		got_end_quote = 0;
		while (cursor < null_terminator) {
			c = *cursor++;
			if (c == '"') {
				got_end_quote = 1;
				break;
			} else if (c == '\\') {
				if (cursor < null_terminator) {
					/* c = *cursor++; */
					cursor++;
					/* the char after '\\' could be ANY
					 * octet */
				}
				/* else, while loop handles incomplete buf */
			} else if (is_qdtext_char(c)) {
				/* just accept char */
			} else
				/* bad quoted text */
				return PARSE_FAILURE;
		}
		if (got_end_quote)
			token->length = (size_t)cursor - (size_t)token->buf;
		else { /* incomplete */

			assert(cursor == null_terminator);
			return PARSE_INCOMPLETE;
		}
	} else if (is_separator_char(c)) {
		/* scan separator */
		token->buf = cursor++;
		token_type = TT_SEPARATOR;
		token->length = (size_t)1;
	} else if (is_control_char(c)) {
		/* scan ctrl char */
		token->buf = cursor++;
		token_type = TT_CTRL;
		token->length = (size_t)1;
	} else
		return PARSE_FAILURE;

	scanner->cursor += token->length; /* move to next token */
	*tok_type = token_type;
	return PARSE_OK;
}